

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::Fixed16Case,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                          .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
                          super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                + 0x18))();
    bVar1 = ParamIterator<int>::operator!=
                      ((ParamIterator<int> *)&this->current_,(ParamIterator<int> *)&this->end_);
    if (!bVar1) {
      ParamIterator<int>::operator=
                ((ParamIterator<int> *)&this->current_,(ParamIterator<int> *)&this->begin_);
      (**(code **)(*(long *)(this->current_).
                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                            .
                            super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
                            ._M_head_impl.impl_._M_t.
                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_>_>
                            .
                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed16Case>_*,_false>
                  + 0x18))();
      ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>::operator!=
                (&(this->current_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                  .
                  super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
                  ._M_head_impl,
                 &(this->end_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                  .
                  super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_false>
                  ._M_head_impl);
    }
    ComputeCurrentValue(this);
    return;
  }
  __assert_fail("!AtEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                ,0x361,
                "virtual void testing::internal::CartesianProductGenerator<google::protobuf::io::(anonymous namespace)::Fixed16Case, int>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1>>::Advance() [T = <google::protobuf::io::(anonymous namespace)::Fixed16Case, int>, I = std::integer_sequence<unsigned long, 0, 1>]"
               );
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }